

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_obj.c
# Opt level: O1

int lj_obj_equal(cTValue *o1,cTValue *o2)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  
  uVar2 = o1->it64 >> 0x2f;
  uVar1 = o2->it64 >> 0x2f;
  if (uVar2 == uVar1) {
    bVar3 = true;
    if (0xfffffffffffffffc < uVar2) goto LAB_001197fa;
    if (0xfffffffffffffff1 < uVar2) {
      bVar3 = o1->it64 == o2->it64;
      goto LAB_001197fa;
    }
  }
  else if (0xfffffffffffffff2 < uVar1 || 0xfffffffffffffff2 < uVar2) {
    bVar3 = false;
    goto LAB_001197fa;
  }
  bVar3 = (bool)(-(o2->n == o1->n) & 1);
LAB_001197fa:
  return (int)bVar3;
}

Assistant:

int LJ_FASTCALL lj_obj_equal(cTValue *o1, cTValue *o2)
{
  if (itype(o1) == itype(o2)) {
    if (tvispri(o1))
      return 1;
    if (!tvisnum(o1))
      return gcrefeq(o1->gcr, o2->gcr);
  } else if (!tvisnumber(o1) || !tvisnumber(o2)) {
    return 0;
  }
  return numberVnum(o1) == numberVnum(o2);
}